

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator>::
Or<ObjWriteGuardBucket(*)(ObjWriteGuardBucket,ObjWriteGuardBucket)>
          (HashTable<ObjWriteGuardBucket,Memory::ArenaAllocator> *this,
          HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this2,
          _func_ObjWriteGuardBucket_ObjWriteGuardBucket_ObjWriteGuardBucket *fn)

{
  int iVar1;
  code *pcVar2;
  NodeBase *pNVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type_conflict pSVar7;
  Type *pTVar8;
  ObjWriteGuardBucket local_e8;
  BVSparse<Memory::JitArenaAllocator> *local_e0;
  Type *local_d8;
  Bucket<ObjWriteGuardBucket> *newBucket_1;
  ObjWriteGuardBucket local_c8;
  BVSparse<Memory::JitArenaAllocator> *local_c0;
  BVSparse<Memory::JitArenaAllocator> *local_b8;
  ObjWriteGuardBucket local_b0;
  BVSparse<Memory::JitArenaAllocator> *local_a8;
  Type *local_a0;
  Bucket<ObjWriteGuardBucket> *newBucket;
  Bucket<ObjWriteGuardBucket> *bucket;
  EditingIterator iter;
  Iterator iter2;
  uint i;
  _func_ObjWriteGuardBucket_ObjWriteGuardBucket_ObjWriteGuardBucket *fn_local;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this2_local;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this_local;
  
  iter2.current._4_4_ = 0;
  do {
    if (*(uint *)(this + 8) <= iter2.current._4_4_) {
      return;
    }
    SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&iter.last,this2->table + iter2.current._4_4_);
    if (iter2.list ==
        (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pNVar3 = iter.last;
    pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       pNVar3,pSVar7);
    if (bVar4) {
      iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   SListNodeBase<Memory::ArenaAllocator>::Next
                             (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&bucket,
               (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               (*(long *)(this + 0x10) + (ulong)iter2.current._4_4_ * 0x10));
    while (bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)&bucket), bVar4) {
      newBucket = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)&bucket);
      while( true ) {
        bVar5 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                ::IsValid((Iterator *)&iter.last);
        bVar4 = false;
        if (bVar5) {
          iVar1 = newBucket->value;
          pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&iter.last);
          bVar4 = iVar1 < pTVar8->value;
        }
        if (!bVar4) break;
        local_a0 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::InsertNodeBefore
                             ((EditingIterator *)&bucket,*(ArenaAllocator **)this);
        pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&iter.last);
        local_a0->value = pTVar8->value;
        ObjWriteGuardBucket::ObjWriteGuardBucket
                  (&local_b0,(BVSparse<Memory::JitArenaAllocator> *)0x0);
        pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&iter.last);
        local_b8 = (pTVar8->element).writeGuards;
        local_a8 = (BVSparse<Memory::JitArenaAllocator> *)
                   (*fn)(local_b0.writeGuards,(ObjWriteGuardBucket)local_b8);
        (local_a0->element).writeGuards = local_a8;
        if (iter2.list ==
            (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pNVar3 = iter.last;
        pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar7);
        if (bVar4) {
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
              IsValid((Iterator *)&iter.last);
      if (!bVar4) break;
      iVar1 = newBucket->value;
      pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&iter.last);
      if (iVar1 == pTVar8->value) {
        local_c8.writeGuards = (newBucket->element).writeGuards;
        pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)&iter.last);
        newBucket_1 = (Bucket<ObjWriteGuardBucket> *)(pTVar8->element).writeGuards;
        local_c0 = (BVSparse<Memory::JitArenaAllocator> *)
                   (*fn)(local_c8,(ObjWriteGuardBucket)newBucket_1);
        (newBucket->element).writeGuards = local_c0;
        if (iter2.list ==
            (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pNVar3 = iter.last;
        pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar7);
        if (bVar4) {
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
    }
    while (bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::IsValid((Iterator *)&iter.last), bVar4) {
      local_d8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
                 EditingIterator::InsertNodeBefore
                           ((EditingIterator *)&bucket,*(ArenaAllocator **)this);
      pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&iter.last);
      local_d8->value = pTVar8->value;
      ObjWriteGuardBucket::ObjWriteGuardBucket(&local_e8,(BVSparse<Memory::JitArenaAllocator> *)0x0)
      ;
      pTVar8 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
               Data((Iterator *)&iter.last);
      local_e0 = (BVSparse<Memory::JitArenaAllocator> *)
                 (*fn)(local_e8.writeGuards,(pTVar8->element).writeGuards);
      (local_d8->element).writeGuards = local_e0;
      if (iter2.list ==
          (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pNVar3 = iter.last;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar4 = SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>
                          *)pNVar3,pSVar7);
      if (bVar4) {
        iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     0x0;
      }
      else {
        iter2.list = (SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                     SListNodeBase<Memory::ArenaAllocator>::Next
                               (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
    }
    iter2.current._4_4_ = iter2.current._4_4_ + 1;
  } while( true );
}

Assistant:

void Or(HashTable<T> * this2, Fn fn)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                    newBucket->value = iter2.Data().value;
                    newBucket->element = fn(nullptr, iter2.Data().element);
                    iter2.Next();
                }

                if (!iter2.IsValid())
                {
                    break;
                }
                if (bucket.value == iter2.Data().value)
                {
                    bucket.element = fn(bucket.element, iter2.Data().element);
                    iter2.Next();
                }
            } NEXT_SLISTBASE_ENTRY_EDITING;

            while (iter2.IsValid())
            {
                Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
                newBucket->value = iter2.Data().value;
                newBucket->element = fn(nullptr, iter2.Data().element);
                iter2.Next();
            }
        }
    }